

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O2

int hash_stream(gost_hash_ctx *ctx,int fd,char *sum)

{
  size_t length;
  int iVar1;
  long lVar2;
  undefined8 uStack_40030;
  uchar buffer [262144];
  
  uStack_40030 = 0x101779;
  start_hash(ctx);
  while( true ) {
    uStack_40030 = 0x10178b;
    length = read(fd,buffer,0x40000);
    if ((long)length < 1) break;
    uStack_40030 = 0x10179e;
    hash_block(ctx,buffer,length);
  }
  if ((long)length < 0) {
    iVar1 = 0;
  }
  else {
    uStack_40030 = 0x1017ad;
    finish_hash(ctx,buffer);
    iVar1 = 1;
    lVar2 = 0x20;
    while (lVar2 != 0) {
      uStack_40030 = 0x1017d5;
      sprintf(sum,"%02x",(ulong)buffer[lVar2 + -1]);
      sum = sum + 2;
      lVar2 = lVar2 + -1;
    }
  }
  return iVar1;
}

Assistant:

int hash_stream(gost_hash_ctx * ctx, int fd, char *sum)
{
    unsigned char buffer[BUF_SIZE];
    ssize_t bytes;
    int i;
    start_hash(ctx);
    while ((bytes = read(fd, buffer, BUF_SIZE)) > 0) {
        hash_block(ctx, buffer, bytes);
    }
    if (bytes < 0) {
        return 0;
    }
    finish_hash(ctx, buffer);
    for (i = 0; i < 32; i++) {
        sprintf(sum + 2 * i, "%02x", buffer[31 - i]);
    }
    return 1;
}